

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_vt_ref_t
flatcc_builder_create_cached_vtable
          (flatcc_builder_t *B,flatbuffers_voffset_t *vt,flatbuffers_voffset_t vt_size,
          uint32_t vt_hash)

{
  flatbuffers_uoffset_t fVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  flatcc_builder_vt_ref_t fVar5;
  size_t sVar6;
  flatcc_builder_vt_ref_t fVar7;
  ulong uVar8;
  flatbuffers_uoffset_t *pfVar9;
  flatcc_builder_vt_ref_t *pfVar10;
  uint uVar11;
  flatbuffers_uoffset_t *pfVar12;
  flatcc_builder_vt_ref_t *pfVar13;
  void *pvVar14;
  uint local_58;
  
  if (B->ht_width == 0) {
    if (B->vd_end != 0) {
      __assert_fail("B->vd_end == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x15e,"int alloc_ht(flatcc_builder_t *)");
    }
    if ((B->buffers[6].iov_len < 0x10) &&
       (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 6,0x10,0,6), iVar4 != 0))
    goto LAB_0011faba;
    if (B->buffers[6].iov_base != (void *)0x0) {
      B->vd_end = 0x10;
      iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 5,0x100,1,5);
      if (iVar4 == 0) {
        uVar3 = 0x100;
        do {
          uVar8 = uVar3;
          uVar3 = uVar8 * 2;
        } while (uVar3 <= B->buffers[5].iov_len);
        sVar6 = 0xffffffffffffffff;
        do {
          sVar6 = sVar6 + 1;
        } while ((ulong)(1L << ((byte)sVar6 & 0x3f)) < uVar8 >> 2);
        B->ht_width = sVar6;
        goto LAB_0011f7a1;
      }
    }
    pfVar9 = (flatbuffers_uoffset_t *)0x0;
  }
  else {
LAB_0011f7a1:
    pfVar9 = (flatbuffers_uoffset_t *)
             ((ulong)(vt_hash >> (-(char)B->ht_width & 0x1fU)) * 4 + (long)B->buffers[5].iov_base);
  }
  if (pfVar9 == (flatbuffers_uoffset_t *)0x0) {
    fVar7 = 0;
  }
  else {
    uVar11 = *pfVar9;
    uVar3 = (ulong)vt_size;
    if (uVar11 == 0) {
      pfVar10 = (flatcc_builder_vt_ref_t *)0x0;
    }
    else {
      pvVar14 = B->buffers[2].iov_base;
      pvVar2 = B->buffers[6].iov_base;
      pfVar12 = pfVar9;
      pfVar10 = (flatcc_builder_vt_ref_t *)0x0;
      do {
        while( true ) {
          pfVar13 = (flatcc_builder_vt_ref_t *)((long)pvVar2 + (ulong)uVar11);
          uVar8 = (ulong)*(uint *)((long)pvVar2 + (ulong)uVar11 + 8);
          if ((*(flatbuffers_voffset_t *)(uVar8 + (long)pvVar14) == vt_size) &&
             (iVar4 = bcmp(vt,(void *)(uVar8 + (long)pvVar14),uVar3), iVar4 == 0)) break;
          uVar11 = pfVar13[3];
          pfVar12 = (flatbuffers_uoffset_t *)(pfVar13 + 3);
          if (uVar11 == 0) goto LAB_0011f8f2;
        }
        if (pfVar13[1] == B->nest_id) {
          if (pfVar12 != pfVar9) {
            *pfVar12 = pfVar13[3];
            pfVar13[3] = *pfVar9;
            *pfVar9 = uVar11;
          }
          goto LAB_0011fa80;
        }
        uVar11 = pfVar13[3];
        pfVar12 = (flatbuffers_uoffset_t *)(pfVar13 + 3);
        pfVar10 = pfVar13;
      } while (uVar11 != 0);
    }
LAB_0011f8f2:
    uVar11 = B->vd_end;
    uVar8 = (ulong)uVar11 + 0x10;
    if ((B->buffers[6].iov_len < uVar8) &&
       (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 6,uVar8,0,6), iVar4 != 0)) {
LAB_0011faba:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
    }
    pfVar13 = (flatcc_builder_vt_ref_t *)((ulong)uVar11 + (long)B->buffers[6].iov_base);
    fVar7 = 0;
    if (pfVar13 != (flatcc_builder_vt_ref_t *)0x0) {
      fVar1 = B->vd_end;
      B->vd_end = fVar1 + 0x10;
      pfVar13[1] = B->nest_id;
      pfVar13[3] = *pfVar9;
      *pfVar9 = fVar1;
      fVar5 = flatcc_builder_create_vtable(B,vt,vt_size);
      *pfVar13 = fVar5;
      fVar7 = 0;
      if (fVar5 != 0) {
        if (pfVar10 == (flatcc_builder_vt_ref_t *)0x0) {
          local_58 = (uint)vt_size;
          if ((B->vb_flush_limit == 0) || ((ulong)(B->vb_end + local_58) <= B->vb_flush_limit)) {
            uVar11 = B->vb_end;
            uVar8 = uVar11 + uVar3;
            if ((B->buffers[2].iov_len < uVar8) &&
               (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 2,uVar8,0,2), iVar4 != 0))
            goto LAB_0011faba;
            pvVar14 = (void *)((ulong)uVar11 + (long)B->buffers[2].iov_base);
            if (pvVar14 == (void *)0x0) {
              return -1;
            }
            fVar1 = B->vb_end;
            pfVar13[2] = fVar1;
            B->vb_end = local_58 + fVar1;
            memcpy(pvVar14,vt,uVar3);
          }
          else if (B->ht_width != 0) {
            memset(B->buffers[5].iov_base,0,B->buffers[5].iov_len);
            B->vb_end = 0;
            B->vd_end = 0x10;
          }
        }
        else {
          pfVar13[2] = pfVar10[2];
        }
LAB_0011fa80:
        fVar7 = *pfVar13;
      }
    }
  }
  return fVar7;
}

Assistant:

flatcc_builder_vt_ref_t flatcc_builder_create_cached_vtable(flatcc_builder_t *B,
        const voffset_t *vt, voffset_t vt_size, uint32_t vt_hash)
{
    vtable_descriptor_t *vd, *vd2;
    uoffset_t *pvd, *pvd_head;
    uoffset_t next;
    voffset_t *vt_;

    /* This just gets the hash table slot, we still have to inspect it. */
    if (!(pvd_head = lookup_ht(B, vt_hash))) {
        return 0;
    }
    pvd = pvd_head;
    next = *pvd;
    /* Tracks if there already is a cached copy. */
    vd2 = 0;
    while (next) {
        vd = vd_ptr(next);
        vt_ = vb_ptr(vd->vb_start);
        if (vt_[0] != vt_size || 0 != memcmp(vt, vt_, vt_size)) {
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Can't share emitted vtables between buffers, */
        if (vd->nest_id != B->nest_id) {
            /* but we don't have to resubmit to cache. */
            vd2 = vd;
            /* See if there is a better match. */
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Move to front hash strategy. */
        if (pvd != pvd_head) {
            *pvd = vd->next;
            vd->next = *pvd_head;
            *pvd_head = next;
        }
        /* vtable exists and has been emitted within current buffer. */
        return vd->vt_ref;
    }
    /* Allocate new descriptor. */
    if (!(vd = reserve_buffer(B, flatcc_builder_alloc_vd, B->vd_end, sizeof(vtable_descriptor_t), 0))) {
        return 0;
    }
    next = B->vd_end;
    B->vd_end += (uoffset_t)sizeof(vtable_descriptor_t);

    /* Identify the buffer this vtable descriptor belongs to. */
    vd->nest_id = B->nest_id;

    /* Move to front hash strategy. */
    vd->next = *pvd_head;
    *pvd_head = next;
    if (0 == (vd->vt_ref = flatcc_builder_create_vtable(B, vt, vt_size))) {
        return 0;
    }
    if (vd2) {
        /* Reuse cached copy. */
        vd->vb_start = vd2->vb_start;
    } else {
        if (B->vb_flush_limit && B->vb_flush_limit < B->vb_end + vt_size) {
            flatcc_builder_flush_vtable_cache(B);
        } else {
            /* Make space in vtable cache. */
            if (!(vt_ = reserve_buffer(B, flatcc_builder_alloc_vb, B->vb_end, vt_size, 0))) {
                return -1;
            }
            vd->vb_start = B->vb_end;
            B->vb_end += vt_size;
            memcpy(vt_, vt, vt_size);
        }
    }
    return vd->vt_ref;
}